

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

int stbi__parse_png_file(stbi__png *z,int scan,int req_comp)

{
  stbi_uc **ppsVar1;
  stbi__uint32 y;
  stbi__context *s;
  stbi__context *psVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  stbi_uc sVar8;
  byte bVar9;
  stbi_uc sVar10;
  byte bVar11;
  byte bVar12;
  stbi__uint32 sVar13;
  stbi__uint32 sVar14;
  uint color;
  uint uVar15;
  uint uVar16;
  int iVar17;
  char *pcVar18;
  stbi_uc *psVar19;
  size_t sVar20;
  ulong uVar21;
  stbi_uc *psVar22;
  ulong uVar23;
  int iVar24;
  long lVar25;
  long lVar26;
  uint uVar27;
  long lVar28;
  uint uVar29;
  uint uVar30;
  uint uVar31;
  stbi_uc *psVar32;
  long lVar33;
  long in_FS_OFFSET;
  int local_51c;
  stbi_uc tc [3];
  ulong local_4e0;
  stbi__uint32 raw_len;
  ulong local_4c0;
  stbi_uc *local_4b8;
  stbi_uc *local_4b0;
  ulong local_4a8;
  stbi_uc *local_4a0;
  ulong local_498;
  stbi__context *local_490;
  size_t local_488;
  int local_47c;
  int local_478;
  int local_474;
  size_t local_470;
  ulong local_468;
  stbi__uint16 tc16 [3];
  stbi_uc palette [1024];
  
  tc[2] = '\0';
  tc[0] = '\0';
  tc[1] = '\0';
  s = z->s;
  ppsVar1 = &z->idata;
  z->idata = (stbi_uc *)0x0;
  z->expanded = (stbi_uc *)0x0;
  z->out = (stbi_uc *)0x0;
  lVar25 = 0;
  do {
    sVar8 = stbi__get8(s);
    sVar10 = (&stbi__check_png_header_png_sig)[lVar25];
    if (sVar8 != sVar10) {
      *(char **)(in_FS_OFFSET + -0x20) = "Not a PNG";
      break;
    }
    lVar25 = lVar25 + 1;
  } while (lVar25 != 8);
  local_51c = 0;
  if ((sVar8 == sVar10) && (local_51c = 1, scan != 1)) {
    bVar5 = true;
    local_468 = 0;
    color = 0;
    bVar6 = false;
    local_4e0 = 0;
    local_470 = 0;
    local_4c0 = 0;
    bVar7 = false;
    bVar12 = 0;
    do {
      sVar13 = stbi__get32be(s);
      sVar20 = (size_t)sVar13;
      sVar14 = stbi__get32be(s);
      uVar27 = (uint)local_4e0;
      if ((int)sVar14 < 0x49484452) {
        if (sVar14 == 0x43674249) {
          bVar6 = true;
LAB_001b008e:
          stbi__skip(s,sVar13);
LAB_001b0372:
          stbi__get32be(s);
          bVar4 = true;
        }
        else {
          iVar17 = (int)local_4c0;
          if (sVar14 == 0x49444154) {
            if (bVar5) goto LAB_001b0151;
            if ((bVar12 != 0) && (uVar27 == 0)) {
LAB_001b0129:
              *(char **)(in_FS_OFFSET + -0x20) = "Corrupt PNG";
              bVar5 = false;
              local_4e0 = 0;
              goto LAB_001b0422;
            }
            if (scan == 2) {
              if (bVar12 != 0) {
                s->img_n = (uint)bVar12;
              }
LAB_001b0228:
              local_51c = 1;
              bVar5 = false;
              goto LAB_001b0230;
            }
            if (0x40000000 < sVar13) {
              pcVar18 = "IDAT section larger than 2^30 bytes";
              goto LAB_001b00fc;
            }
            uVar27 = sVar13 + iVar17;
            if ((int)uVar27 < iVar17) {
LAB_001b03ee:
              bVar5 = false;
              local_51c = 0;
              bVar4 = false;
            }
            else {
              if ((uint)local_470 < uVar27) {
                if (sVar13 < 0x1001) {
                  sVar20 = 0x1000;
                }
                if ((uint)local_470 != 0) {
                  sVar20 = local_470 & 0xffffffff;
                }
                do {
                  local_470 = sVar20;
                  sVar20 = (ulong)((uint)local_470 * 2);
                } while ((uint)local_470 < uVar27);
                psVar19 = (stbi_uc *)realloc(*ppsVar1,local_470);
                if (psVar19 == (stbi_uc *)0x0) {
                  *(char **)(in_FS_OFFSET + -0x20) = "Out of memory";
                  goto LAB_001b03ee;
                }
                *ppsVar1 = psVar19;
              }
              iVar17 = stbi__getn(s,*ppsVar1 + (local_4c0 & 0xffffffff),sVar13);
              if (iVar17 != 0) {
                local_4c0 = (ulong)uVar27;
                goto LAB_001b0c03;
              }
              *(char **)(in_FS_OFFSET + -0x20) = "Corrupt PNG";
              bVar5 = false;
              bVar4 = false;
              local_51c = 0;
            }
          }
          else {
            if (sVar14 != 0x49454e44) {
LAB_001b00e0:
              if (!bVar5) {
                bVar5 = false;
                if ((sVar14 >> 0x1d & 1) == 0) {
                  pcVar18 = "PNG not supported: unknown PNG chunk type";
LAB_001b00fc:
                  *(char **)(in_FS_OFFSET + -0x20) = pcVar18;
                  goto LAB_001b0418;
                }
                goto LAB_001b008e;
              }
              goto LAB_001b0151;
            }
            if (bVar5) {
LAB_001afffc:
              *(char **)(in_FS_OFFSET + -0x20) = "Corrupt PNG";
              local_51c = 0;
            }
            else if (scan == 0) {
              if (*ppsVar1 == (stbi_uc *)0x0) goto LAB_001afffc;
              raw_len = s->img_n * s->img_y * (z->depth * s->img_x + 7 >> 3) + s->img_y;
              psVar19 = (stbi_uc *)
                        stbi_zlib_decode_malloc_guesssize_headerflag
                                  ((char *)*ppsVar1,iVar17,raw_len,(int *)&raw_len,(uint)!bVar6);
              z->expanded = psVar19;
              local_51c = 0;
              if (psVar19 != (stbi_uc *)0x0) {
                free(*ppsVar1);
                sVar13 = raw_len;
                *ppsVar1 = (stbi_uc *)0x0;
                iVar17 = s->img_n + 1;
                if (bVar7 || (bVar12 == 0 && req_comp != 3) && iVar17 == req_comp) {
                  s->img_out_n = iVar17;
                }
                else {
                  s->img_out_n = s->img_n;
                }
                iVar17 = s->img_out_n;
                uVar27 = z->depth;
                iVar24 = iVar17 << (uVar27 == 0x10);
                sVar14 = z->s->img_x;
                y = z->s->img_y;
                if ((int)local_468 == 0) {
                  iVar17 = stbi__create_png_image_raw
                                     (z,z->expanded,raw_len,iVar17,sVar14,y,uVar27,color);
                  if (iVar17 != 0) goto LAB_001b085b;
                }
                else {
                  local_4b8 = z->expanded;
                  local_4a8 = (ulong)uVar27;
                  local_4b0 = (stbi_uc *)stbi__malloc_mad3(sVar14,y,iVar24,0);
                  if (local_4b0 != (stbi_uc *)0x0) {
                    local_488 = (size_t)iVar24;
                    lVar25 = 0;
                    psVar19 = local_4b8;
                    uVar21 = local_4a8;
                    local_47c = iVar24;
                    do {
                      psVar2 = z->s;
                      local_4a0 = (stbi_uc *)(long)(int)(&DAT_001cd0b0)[lVar25];
                      uVar27 = (&DAT_001cd0f0)[lVar25];
                      uVar30 = ~(&DAT_001cd0b0)[lVar25] + psVar2->img_x + uVar27;
                      uVar15 = uVar30 / uVar27;
                      uVar31 = (&DAT_001cd110)[lVar25];
                      local_490 = (stbi__context *)CONCAT44(local_490._4_4_,(&DAT_001cd0d0)[lVar25])
                      ;
                      uVar29 = ~(&DAT_001cd0d0)[lVar25] + psVar2->img_y + uVar31;
                      uVar16 = uVar29 / uVar31;
                      bVar4 = true;
                      if ((uVar27 <= uVar30) && (uVar31 <= uVar29)) {
                        local_478 = uVar15 * (int)uVar21 * psVar2->img_n;
                        local_4b8 = psVar19;
                        iVar24 = stbi__create_png_image_raw
                                           (z,psVar19,sVar13,iVar17,uVar15,uVar16,(int)uVar21,color)
                        ;
                        if (iVar24 == 0) {
                          free(local_4b0);
                          bVar4 = false;
                          psVar19 = local_4b8;
                          uVar21 = local_4a8;
                        }
                        else {
                          if (0 < (int)uVar16) {
                            iVar24 = (int)local_490 * local_47c;
                            local_474 = uVar31 * local_47c;
                            local_4a0 = local_4b0 + (long)local_4a0 * local_488;
                            lVar26 = (long)(int)uVar27 * local_488;
                            local_498 = 0;
                            sVar20 = local_488;
                            do {
                              if (0 < (int)uVar15) {
                                local_490 = z->s;
                                psVar19 = z->out;
                                lVar33 = local_498 * (long)(int)uVar15;
                                lVar28 = 0;
                                psVar32 = local_4a0;
                                do {
                                  memcpy(psVar32 + local_490->img_x * iVar24,
                                         psVar19 + (lVar33 + lVar28) * sVar20,local_488);
                                  lVar28 = lVar28 + 1;
                                  psVar32 = psVar32 + lVar26;
                                  sVar20 = local_488;
                                } while (lVar28 < (int)uVar15);
                              }
                              local_498 = local_498 + 1;
                              iVar24 = iVar24 + local_474;
                            } while (local_498 < uVar16);
                          }
                          uVar16 = ((local_478 + 7 >> 3) + 1) * uVar16;
                          free(z->out);
                          sVar13 = sVar13 - uVar16;
                          bVar4 = true;
                          psVar19 = local_4b8 + uVar16;
                          uVar21 = local_4a8;
                        }
                      }
                      if (!bVar4) goto LAB_001b0230;
                      lVar25 = lVar25 + 1;
                    } while (lVar25 != 7);
                    z->out = local_4b0;
LAB_001b085b:
                    if (bVar7) {
                      if (z->depth == 0x10) {
                        stbi__compute_transparency16(z,tc16,s->img_out_n);
                      }
                      else {
                        stbi__compute_transparency(z,tc,s->img_out_n);
                      }
                    }
                    if (bVar6) {
                      iVar17 = stbi__de_iphone_flag_global;
                      if (*(int *)(in_FS_OFFSET + -4) != 0) {
                        iVar17 = *(int *)(in_FS_OFFSET + -8);
                      }
                      if ((iVar17 != 0) && (2 < s->img_out_n)) {
                        stbi__de_iphone(z);
                      }
                    }
                    if (bVar12 == 0) {
                      if (bVar7) {
                        s->img_n = s->img_n + 1;
                      }
                    }
                    else {
                      s->img_n = (uint)bVar12;
                      uVar27 = (uint)bVar12;
                      if (2 < req_comp) {
                        uVar27 = req_comp;
                      }
                      s->img_out_n = uVar27;
                      psVar19 = z->out;
                      uVar31 = z->s->img_y * z->s->img_x;
                      psVar32 = (stbi_uc *)stbi__malloc_mad2(uVar31,uVar27,0);
                      if (psVar32 == (stbi_uc *)0x0) {
                        *(char **)(in_FS_OFFSET + -0x20) = "Out of memory";
                      }
                      else {
                        if (uVar27 == 3) {
                          if (uVar31 != 0) {
                            uVar21 = 0;
                            psVar22 = psVar32;
                            do {
                              uVar23 = (ulong)psVar19[uVar21];
                              *psVar22 = palette[uVar23 * 4];
                              psVar22[1] = palette[uVar23 * 4 + 1];
                              psVar22[2] = palette[uVar23 * 4 + 2];
                              psVar22 = psVar22 + 3;
                              uVar21 = uVar21 + 1;
                            } while (uVar31 != uVar21);
                          }
                        }
                        else if (uVar31 != 0) {
                          uVar21 = 0;
                          do {
                            uVar23 = (ulong)psVar19[uVar21];
                            psVar32[uVar21 * 4] = palette[uVar23 * 4];
                            psVar32[uVar21 * 4 + 1] = palette[uVar23 * 4 + 1];
                            psVar32[uVar21 * 4 + 2] = palette[uVar23 * 4 + 2];
                            psVar32[uVar21 * 4 + 3] = palette[uVar23 * 4 + 3];
                            uVar21 = uVar21 + 1;
                          } while (uVar31 != uVar21);
                        }
                        free(psVar19);
                        z->out = psVar32;
                      }
                      if (psVar32 == (stbi_uc *)0x0) goto LAB_001b0230;
                    }
                    free(z->expanded);
                    z->expanded = (stbi_uc *)0x0;
                    stbi__get32be(s);
                    goto LAB_001b0172;
                  }
                  *(char **)(in_FS_OFFSET + -0x20) = "Out of memory";
                }
              }
            }
            else {
LAB_001b0172:
              local_51c = 1;
            }
LAB_001b0230:
            bVar4 = false;
          }
        }
      }
      else {
        if (sVar14 == 0x74524e53) {
          if (bVar5) goto LAB_001b0151;
          if (*ppsVar1 == (stbi_uc *)0x0) {
            if (bVar12 == 0) {
              uVar27 = s->img_n;
              if (((uVar27 & 1) == 0) || (uVar27 * 2 != sVar13)) {
                *(char **)(in_FS_OFFSET + -0x20) = "Corrupt PNG";
                bVar5 = false;
                bVar12 = 0;
                goto LAB_001b0422;
              }
              if (scan != 2) {
                bVar7 = true;
                if (z->depth == 0x10) {
                  if (0 < s->img_n) {
                    uVar21 = 0;
                    do {
                      sVar10 = stbi__get8(s);
                      sVar8 = stbi__get8(s);
                      tc16[uVar21] = CONCAT11(sVar10,sVar8);
                      if (1 < uVar21) {
                        bVar12 = 0;
                        goto LAB_001b0c03;
                      }
                      uVar21 = uVar21 + 1;
                    } while ((long)uVar21 < (long)s->img_n);
                    bVar12 = 0;
                    goto LAB_001b0c03;
                  }
                }
                else if (0 < s->img_n) {
                  uVar21 = 0;
                  do {
                    stbi__get8(s);
                    sVar10 = stbi__get8(s);
                    tc[uVar21] = ""[z->depth] * sVar10;
                    if (1 < uVar21) break;
                    uVar21 = uVar21 + 1;
                  } while ((long)uVar21 < (long)s->img_n);
                }
                bVar5 = false;
                bVar12 = 0;
                goto LAB_001b0372;
              }
              s->img_n = uVar27 + 1;
              local_51c = 1;
              bVar7 = true;
              bVar5 = false;
              bVar4 = false;
              bVar12 = 0;
              goto LAB_001b042a;
            }
            if (scan == 2) {
              s->img_n = 4;
              goto LAB_001b0228;
            }
            if (uVar27 == 0) goto LAB_001b0129;
            if (uVar27 < sVar13) goto LAB_001b040f;
            bVar12 = 4;
            bVar5 = false;
            if (sVar13 == 0) goto LAB_001b0372;
            uVar21 = 0;
            do {
              sVar10 = stbi__get8(s);
              palette[uVar21 * 4 + 3] = sVar10;
              uVar21 = uVar21 + 1;
              bVar12 = 4;
            } while (sVar20 != uVar21);
LAB_001b0c03:
            bVar5 = false;
            goto LAB_001b0372;
          }
LAB_001b040f:
          *(char **)(in_FS_OFFSET + -0x20) = "Corrupt PNG";
LAB_001b0418:
          bVar5 = false;
        }
        else {
          if (sVar14 != 0x504c5445) {
            if (sVar14 != 0x49484452) goto LAB_001b00e0;
            if ((!bVar5) || (sVar13 != 0xd)) goto LAB_001b034a;
            sVar13 = stbi__get32be(s);
            s->img_x = sVar13;
            sVar13 = stbi__get32be(s);
            s->img_y = sVar13;
            if ((sVar13 < 0x1000001) && (s->img_x < 0x1000001)) {
              bVar9 = stbi__get8(s);
              z->depth = (uint)bVar9;
              if ((0x10 < bVar9) || ((0x10116U >> (bVar9 & 0x1f) & 1) == 0)) {
                pcVar18 = "PNG not supported: 1/2/4/8/16-bit only";
                goto LAB_001b0078;
              }
              bVar9 = stbi__get8(s);
              color = (uint)bVar9;
              if (6 < bVar9) {
LAB_001b034a:
                *(char **)(in_FS_OFFSET + -0x20) = "Corrupt PNG";
                goto LAB_001b0353;
              }
              if (bVar9 == 3) {
                bVar11 = 3;
                if (z->depth != 0x10) goto LAB_001b089c;
                *(char **)(in_FS_OFFSET + -0x20) = "Corrupt PNG";
                color = 3;
LAB_001b091e:
                bVar3 = false;
                local_51c = 0;
              }
              else {
                bVar11 = bVar12;
                if ((bVar9 & 1) != 0) goto LAB_001b034a;
LAB_001b089c:
                bVar12 = bVar11;
                sVar10 = stbi__get8(s);
                if ((sVar10 != '\0') || (sVar10 = stbi__get8(s), sVar10 != '\0')) {
LAB_001b0906:
                  *(char **)(in_FS_OFFSET + -0x20) = "Corrupt PNG";
                  goto LAB_001b091e;
                }
                bVar11 = stbi__get8(s);
                local_468 = (ulong)bVar11;
                if ((1 < bVar11) ||
                   ((uVar27 = s->img_x, uVar27 == 0 || (uVar31 = s->img_y, uVar31 == 0))))
                goto LAB_001b0906;
                if (bVar12 == 0) {
                  uVar15 = (uint)(3 < bVar9) + (bVar9 & 2) + 1;
                  s->img_n = uVar15;
                  if (uVar31 <= (uint)((0x40000000 / (ulong)uVar27) / (ulong)uVar15))
                  goto LAB_001b0d0b;
                  *(char **)(in_FS_OFFSET + -0x20) = "Image too large to decode";
                  bVar3 = false;
                  bVar12 = 0;
                  local_51c = 0;
                }
                else {
                  s->img_n = 1;
                  if ((uint)(0x40000000 / (ulong)uVar27 >> 2) < uVar31) goto LAB_001b0906;
LAB_001b0d0b:
                  bVar3 = true;
                }
              }
            }
            else {
              pcVar18 = "Very large image (corrupt?)";
LAB_001b0078:
              *(char **)(in_FS_OFFSET + -0x20) = pcVar18;
LAB_001b0353:
              bVar3 = false;
              local_51c = 0;
            }
            bVar5 = false;
            bVar4 = false;
            if (bVar3) goto LAB_001b0372;
            goto LAB_001b042a;
          }
          if (!bVar5) {
            if ((0x300 < sVar13) || (local_4e0 = sVar20 / 3, (sVar13 / 3) * 3 != sVar13))
            goto LAB_001b040f;
            bVar5 = false;
            if (2 < sVar13) {
              uVar21 = 0;
              do {
                sVar10 = stbi__get8(s);
                palette[uVar21 * 4] = sVar10;
                sVar10 = stbi__get8(s);
                palette[uVar21 * 4 + 1] = sVar10;
                sVar10 = stbi__get8(s);
                palette[uVar21 * 4 + 2] = sVar10;
                palette[uVar21 * 4 + 3] = 0xff;
                uVar21 = uVar21 + 1;
              } while (local_4e0 != uVar21);
              goto LAB_001b0c03;
            }
            goto LAB_001b0372;
          }
LAB_001b0151:
          *(char **)(in_FS_OFFSET + -0x20) = "Corrupt PNG";
          bVar5 = true;
        }
LAB_001b0422:
        bVar4 = false;
        local_51c = 0;
      }
LAB_001b042a:
    } while (bVar4);
  }
  return local_51c;
}

Assistant:

static int stbi__parse_png_file(stbi__png *z, int scan, int req_comp)
{
   stbi_uc palette[1024], pal_img_n=0;
   stbi_uc has_trans=0, tc[3]={0};
   stbi__uint16 tc16[3];
   stbi__uint32 ioff=0, idata_limit=0, i, pal_len=0;
   int first=1,k,interlace=0, color=0, is_iphone=0;
   stbi__context *s = z->s;

   z->expanded = NULL;
   z->idata = NULL;
   z->out = NULL;

   if (!stbi__check_png_header(s)) return 0;

   if (scan == STBI__SCAN_type) return 1;

   for (;;) {
      stbi__pngchunk c = stbi__get_chunk_header(s);
      switch (c.type) {
         case STBI__PNG_TYPE('C','g','B','I'):
            is_iphone = 1;
            stbi__skip(s, c.length);
            break;
         case STBI__PNG_TYPE('I','H','D','R'): {
            int comp,filter;
            if (!first) return stbi__err("multiple IHDR","Corrupt PNG");
            first = 0;
            if (c.length != 13) return stbi__err("bad IHDR len","Corrupt PNG");
            s->img_x = stbi__get32be(s);
            s->img_y = stbi__get32be(s);
            if (s->img_y > STBI_MAX_DIMENSIONS) return stbi__err("too large","Very large image (corrupt?)");
            if (s->img_x > STBI_MAX_DIMENSIONS) return stbi__err("too large","Very large image (corrupt?)");
            z->depth = stbi__get8(s);  if (z->depth != 1 && z->depth != 2 && z->depth != 4 && z->depth != 8 && z->depth != 16)  return stbi__err("1/2/4/8/16-bit only","PNG not supported: 1/2/4/8/16-bit only");
            color = stbi__get8(s);  if (color > 6)         return stbi__err("bad ctype","Corrupt PNG");
            if (color == 3 && z->depth == 16)                  return stbi__err("bad ctype","Corrupt PNG");
            if (color == 3) pal_img_n = 3; else if (color & 1) return stbi__err("bad ctype","Corrupt PNG");
            comp  = stbi__get8(s);  if (comp) return stbi__err("bad comp method","Corrupt PNG");
            filter= stbi__get8(s);  if (filter) return stbi__err("bad filter method","Corrupt PNG");
            interlace = stbi__get8(s); if (interlace>1) return stbi__err("bad interlace method","Corrupt PNG");
            if (!s->img_x || !s->img_y) return stbi__err("0-pixel image","Corrupt PNG");
            if (!pal_img_n) {
               s->img_n = (color & 2 ? 3 : 1) + (color & 4 ? 1 : 0);
               if ((1 << 30) / s->img_x / s->img_n < s->img_y) return stbi__err("too large", "Image too large to decode");
            } else {
               // if paletted, then pal_n is our final components, and
               // img_n is # components to decompress/filter.
               s->img_n = 1;
               if ((1 << 30) / s->img_x / 4 < s->img_y) return stbi__err("too large","Corrupt PNG");
            }
            // even with SCAN_header, have to scan to see if we have a tRNS
            break;
         }

         case STBI__PNG_TYPE('P','L','T','E'):  {
            if (first) return stbi__err("first not IHDR", "Corrupt PNG");
            if (c.length > 256*3) return stbi__err("invalid PLTE","Corrupt PNG");
            pal_len = c.length / 3;
            if (pal_len * 3 != c.length) return stbi__err("invalid PLTE","Corrupt PNG");
            for (i=0; i < pal_len; ++i) {
               palette[i*4+0] = stbi__get8(s);
               palette[i*4+1] = stbi__get8(s);
               palette[i*4+2] = stbi__get8(s);
               palette[i*4+3] = 255;
            }
            break;
         }

         case STBI__PNG_TYPE('t','R','N','S'): {
            if (first) return stbi__err("first not IHDR", "Corrupt PNG");
            if (z->idata) return stbi__err("tRNS after IDAT","Corrupt PNG");
            if (pal_img_n) {
               if (scan == STBI__SCAN_header) { s->img_n = 4; return 1; }
               if (pal_len == 0) return stbi__err("tRNS before PLTE","Corrupt PNG");
               if (c.length > pal_len) return stbi__err("bad tRNS len","Corrupt PNG");
               pal_img_n = 4;
               for (i=0; i < c.length; ++i)
                  palette[i*4+3] = stbi__get8(s);
            } else {
               if (!(s->img_n & 1)) return stbi__err("tRNS with alpha","Corrupt PNG");
               if (c.length != (stbi__uint32) s->img_n*2) return stbi__err("bad tRNS len","Corrupt PNG");
               has_trans = 1;
               // non-paletted with tRNS = constant alpha. if header-scanning, we can stop now.
               if (scan == STBI__SCAN_header) { ++s->img_n; return 1; }
               if (z->depth == 16) {
                  for (k = 0; k < s->img_n && k < 3; ++k) // extra loop test to suppress false GCC warning
                     tc16[k] = (stbi__uint16)stbi__get16be(s); // copy the values as-is
               } else {
                  for (k = 0; k < s->img_n && k < 3; ++k)
                     tc[k] = (stbi_uc)(stbi__get16be(s) & 255) * stbi__depth_scale_table[z->depth]; // non 8-bit images will be larger
               }
            }
            break;
         }

         case STBI__PNG_TYPE('I','D','A','T'): {
            if (first) return stbi__err("first not IHDR", "Corrupt PNG");
            if (pal_img_n && !pal_len) return stbi__err("no PLTE","Corrupt PNG");
            if (scan == STBI__SCAN_header) {
               // header scan definitely stops at first IDAT
               if (pal_img_n)
                  s->img_n = pal_img_n;
               return 1;
            }
            if (c.length > (1u << 30)) return stbi__err("IDAT size limit", "IDAT section larger than 2^30 bytes");
            if ((int)(ioff + c.length) < (int)ioff) return 0;
            if (ioff + c.length > idata_limit) {
               stbi__uint32 idata_limit_old = idata_limit;
               stbi_uc *p;
               if (idata_limit == 0) idata_limit = c.length > 4096 ? c.length : 4096;
               while (ioff + c.length > idata_limit)
                  idata_limit *= 2;
               STBI_NOTUSED(idata_limit_old);
               p = (stbi_uc *) STBI_REALLOC_SIZED(z->idata, idata_limit_old, idata_limit); if (p == NULL) return stbi__err("outofmem", "Out of memory");
               z->idata = p;
            }
            if (!stbi__getn(s, z->idata+ioff,c.length)) return stbi__err("outofdata","Corrupt PNG");
            ioff += c.length;
            break;
         }

         case STBI__PNG_TYPE('I','E','N','D'): {
            stbi__uint32 raw_len, bpl;
            if (first) return stbi__err("first not IHDR", "Corrupt PNG");
            if (scan != STBI__SCAN_load) return 1;
            if (z->idata == NULL) return stbi__err("no IDAT","Corrupt PNG");
            // initial guess for decoded data size to avoid unnecessary reallocs
            bpl = (s->img_x * z->depth + 7) / 8; // bytes per line, per component
            raw_len = bpl * s->img_y * s->img_n /* pixels */ + s->img_y /* filter mode per row */;
            z->expanded = (stbi_uc *) stbi_zlib_decode_malloc_guesssize_headerflag((char *) z->idata, ioff, raw_len, (int *) &raw_len, !is_iphone);
            if (z->expanded == NULL) return 0; // zlib should set error
            STBI_FREE(z->idata); z->idata = NULL;
            if ((req_comp == s->img_n+1 && req_comp != 3 && !pal_img_n) || has_trans)
               s->img_out_n = s->img_n+1;
            else
               s->img_out_n = s->img_n;
            if (!stbi__create_png_image(z, z->expanded, raw_len, s->img_out_n, z->depth, color, interlace)) return 0;
            if (has_trans) {
               if (z->depth == 16) {
                  if (!stbi__compute_transparency16(z, tc16, s->img_out_n)) return 0;
               } else {
                  if (!stbi__compute_transparency(z, tc, s->img_out_n)) return 0;
               }
            }
            if (is_iphone && stbi__de_iphone_flag && s->img_out_n > 2)
               stbi__de_iphone(z);
            if (pal_img_n) {
               // pal_img_n == 3 or 4
               s->img_n = pal_img_n; // record the actual colors we had
               s->img_out_n = pal_img_n;
               if (req_comp >= 3) s->img_out_n = req_comp;
               if (!stbi__expand_png_palette(z, palette, pal_len, s->img_out_n))
                  return 0;
            } else if (has_trans) {
               // non-paletted image with tRNS -> source image has (constant) alpha
               ++s->img_n;
            }
            STBI_FREE(z->expanded); z->expanded = NULL;
            // end of PNG chunk, read and skip CRC
            stbi__get32be(s);
            return 1;
         }

         default:
            // if critical, fail
            if (first) return stbi__err("first not IHDR", "Corrupt PNG");
            if ((c.type & (1 << 29)) == 0) {
               #ifndef STBI_NO_FAILURE_STRINGS
               // not threadsafe
               static char invalid_chunk[] = "XXXX PNG chunk not known";
               invalid_chunk[0] = STBI__BYTECAST(c.type >> 24);
               invalid_chunk[1] = STBI__BYTECAST(c.type >> 16);
               invalid_chunk[2] = STBI__BYTECAST(c.type >>  8);
               invalid_chunk[3] = STBI__BYTECAST(c.type >>  0);
               #endif
               return stbi__err(invalid_chunk, "PNG not supported: unknown PNG chunk type");
            }
            stbi__skip(s, c.length);
            break;
      }
      // end of PNG chunk, read and skip CRC
      stbi__get32be(s);
   }
}